

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O0

void __thiscall nv::DirectDrawSurface::DirectDrawSurface(DirectDrawSurface *this,char *name)

{
  uint uVar1;
  Stream *this_00;
  char *name_local;
  DirectDrawSurface *this_local;
  
  this_00 = (Stream *)operator_new(0x20);
  StdInputStream::StdInputStream((StdInputStream *)this_00,name);
  this->stream = this_00;
  DDSHeader::DDSHeader(&this->header);
  uVar1 = (*this->stream->_vptr_Stream[6])();
  if ((uVar1 & 1) == 0) {
    nv::operator<<(this->stream,&this->header);
  }
  return;
}

Assistant:

DirectDrawSurface::DirectDrawSurface(const char * name) : stream(new StdInputStream(name))
{
	if (!stream->isError())
	{
		(*stream) << header;
	}
}